

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

bool __thiscall
cmGeneratorTarget::GetConfigCommonSourceFilesForXcode
          (cmGeneratorTarget *this,vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *files)

{
  pointer ppcVar1;
  cmSourceFile *pcVar2;
  cmLocalGenerator *this_00;
  int iVar3;
  string *psVar4;
  ostream *poVar5;
  bool bVar6;
  pointer ppcVar7;
  iterator __begin3;
  pointer __s2;
  pointer ppcVar8;
  pointer config;
  iterator __end3;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> configFiles;
  string thisConfigFiles;
  string firstConfigFiles;
  ostringstream e;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_248;
  string local_228;
  char *local_208;
  long local_200;
  char local_1f8;
  undefined7 uStack_1f7;
  char *local_1e8;
  long local_1e0;
  char local_1d8;
  undefined7 uStack_1d7;
  string *local_1c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c0;
  undefined1 local_1a8 [376];
  
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_1c0,this->Makefile,IncludeEmptyConfig);
  GetSourceFilesWithoutObjectLibraries
            (this,files,
             local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  bVar6 = true;
  if (local_1c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1c8 = local_1c0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    config = local_1c0.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GetSourceFilesWithoutObjectLibraries(this,&local_248,config);
      ppcVar7 = local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      ppcVar8 = local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      __s2 = (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
      ppcVar1 = (files->super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>)._M_impl
                .super__Vector_impl_data._M_finish;
      if (((long)local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start != (long)ppcVar1 - (long)__s2) ||
         ((local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
           super__Vector_impl_data._M_start &&
          (iVar3 = bcmp(local_248.
                        super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                        super__Vector_impl_data._M_start,__s2,
                        (long)local_248.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_248.
                              super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                              _M_impl.super__Vector_impl_data._M_start), iVar3 != 0)))) {
        local_1e8 = &local_1d8;
        local_1e0 = 0;
        local_1d8 = '\0';
        if (__s2 != ppcVar1) {
          do {
            pcVar2 = *__s2;
            std::__cxx11::string::append((char *)&local_1e8);
            psVar4 = cmSourceFile::ResolveFullPath(pcVar2,(string *)0x0,(string *)0x0);
            std::__cxx11::string::_M_append((char *)&local_1e8,(ulong)(psVar4->_M_dataplus)._M_p);
            __s2 = __s2 + 1;
            ppcVar7 = local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            ppcVar8 = local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
          } while (__s2 != ppcVar1);
        }
        local_208 = &local_1f8;
        local_200 = 0;
        local_1f8 = '\0';
        if (ppcVar8 != ppcVar7) {
          do {
            pcVar2 = *ppcVar8;
            std::__cxx11::string::append((char *)&local_208);
            psVar4 = cmSourceFile::ResolveFullPath(pcVar2,(string *)0x0,(string *)0x0);
            std::__cxx11::string::_M_append((char *)&local_208,(ulong)(psVar4->_M_dataplus)._M_p);
            ppcVar8 = ppcVar8 + 1;
          } while (ppcVar8 != ppcVar7);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        psVar4 = cmTarget::GetName_abi_cxx11_(this->Target);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,
                   "\" has source files which vary by configuration. This is not supported by the \""
                   ,0x4e);
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[3])(&local_228);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_228._M_dataplus._M_p,local_228._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" generator.\nConfig \"",0x15);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(local_1c8->_M_dataplus)._M_p,local_1c8->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\n  ",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_1e8,local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\nConfig \"",9);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,(config->_M_dataplus)._M_p,config->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\":\n  ",5);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_208,local_200);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        this_00 = this->LocalGenerator;
        std::__cxx11::stringbuf::str();
        cmLocalGenerator::IssueMessage(this_00,FATAL_ERROR,&local_228);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_228._M_dataplus._M_p != &local_228.field_2) {
          operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
        if (local_208 != &local_1f8) {
          operator_delete(local_208,CONCAT71(uStack_1f7,local_1f8) + 1);
        }
        if (local_1e8 != &local_1d8) {
          operator_delete(local_1e8,CONCAT71(uStack_1d7,local_1d8) + 1);
        }
        if (local_248.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_248.
                          super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_248.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_248.
                                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        bVar6 = false;
        goto LAB_00365563;
      }
      if (ppcVar8 != (pointer)0x0) {
        operator_delete(ppcVar8,(long)local_248.
                                      super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)ppcVar8);
      }
      config = config + 1;
    } while (config != local_1c0.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    bVar6 = true;
  }
LAB_00365563:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0);
  return bVar6;
}

Assistant:

bool cmGeneratorTarget::GetConfigCommonSourceFilesForXcode(
  std::vector<cmSourceFile*>& files) const
{
  std::vector<std::string> const& configs =
    this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  auto it = configs.begin();
  const std::string& firstConfig = *it;
  this->GetSourceFilesWithoutObjectLibraries(files, firstConfig);

  for (; it != configs.end(); ++it) {
    std::vector<cmSourceFile*> configFiles;
    this->GetSourceFilesWithoutObjectLibraries(configFiles, *it);
    if (configFiles != files) {
      std::string firstConfigFiles;
      const char* sep = "";
      for (cmSourceFile* f : files) {
        firstConfigFiles += sep;
        firstConfigFiles += f->ResolveFullPath();
        sep = "\n  ";
      }

      std::string thisConfigFiles;
      sep = "";
      for (cmSourceFile* f : configFiles) {
        thisConfigFiles += sep;
        thisConfigFiles += f->ResolveFullPath();
        sep = "\n  ";
      }
      std::ostringstream e;
      /* clang-format off */
      e << "Target \"" << this->GetName()
        << "\" has source files which vary by "
        "configuration. This is not supported by the \""
        << this->GlobalGenerator->GetName()
        << "\" generator.\n"
          "Config \"" << firstConfig << "\":\n"
          "  " << firstConfigFiles << "\n"
          "Config \"" << *it << "\":\n"
          "  " << thisConfigFiles << "\n";
      /* clang-format on */
      this->LocalGenerator->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return false;
    }
  }
  return true;
}